

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void __thiscall TestMaterial::RandomTestSupportFunction(TestMaterial *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  time_t tVar9;
  clock_t cVar10;
  clock_t cVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_> v
  ;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"RandomTestSupportFunction");
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&supportVector,1000000,(allocator_type *)&v);
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector(&v,1000000,(allocator_type *)&local_68);
  for (lVar12 = 0x10; lVar12 != 0x16e3610; lVar12 = lVar12 + 0x18) {
    iVar4 = rand();
    iVar5 = rand();
    iVar6 = rand();
    iVar7 = rand();
    dVar13 = log((double)iVar4 / 2147483647.0);
    dVar13 = dVar13 * -2.0;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    dVar14 = cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
    dVar15 = log((double)iVar5 / 2147483647.0);
    dVar15 = dVar15 * -2.0;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      dVar15 = SQRT(dVar15);
    }
    dVar16 = cos(((double)iVar4 / 2147483647.0) * 6.283185307179586);
    dVar17 = log((double)iVar6 / 2147483647.0);
    dVar17 = dVar17 * -2.0;
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar18 = cos(((double)iVar7 / 2147483647.0) * 6.283185307179586);
    pdVar2 = (double *)
             ((long)v.
                    super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar12 + -0x10);
    *pdVar2 = dVar14 * dVar13;
    pdVar2[1] = dVar16 * dVar15;
    *(double *)
     ((long)&(v.
              super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar12) = dVar18 * dVar17;
  }
  cVar10 = clock();
  for (lVar12 = 0; lVar12 != 24000000; lVar12 = lVar12 + 0x18) {
    plVar3 = *(long **)(*(long *)&this->field_0x8 + (ulong)this->CurrentObj * 8);
    (**(code **)(*plVar3 + 0x20))
              (&local_68,plVar3,
               (long)&(v.
                       super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar12);
    *(undefined8 *)
     ((long)&(supportVector.
              super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_z + lVar12) = local_58;
    puVar1 = (undefined8 *)
             ((long)&(supportVector.
                      super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_x + lVar12);
    *puVar1 = local_68;
    puVar1[1] = uStack_60;
  }
  cVar11 = clock();
  std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar8 = std::ostream::_M_insert<double>((double)(cVar11 - cVar10) / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&v.
                   super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 );
  std::
  _Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ::~_Vector_base(&supportVector.
                   super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                 );
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunction()
{
  std::cout << "RandomTestSupportFunction" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd);

  clock_t begin, end;
  srand(static_cast<unsigned int>(time(NULL)));



  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {

    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();

  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    supportVector[j] = sObj[CurrentObj]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

  // print the data in a file
#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupport_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for (long j=0; j<RandomTestEnd; j++)
    outfile<< supportVector[j] <<std::endl;
  outfile.close();
#endif // OUTPUT_FILE
}